

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execCmp<(moira::Instr)37,(moira::Mode)8,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  u32 uVar2;
  long lVar3;
  bool error;
  bool local_19;
  
  uVar2 = computeEA<(moira::Mode)8,(moira::Size)4,0ul>(this,opcode & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,uVar2,&local_19);
  if (local_19 == false) {
    uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
    lVar3 = (ulong)uVar1 - (ulong)uVar2;
    (this->reg).sr.c = (bool)((byte)((ulong)lVar3 >> 0x20) & 1);
    (this->reg).sr.v = (int)(((uint)lVar3 ^ uVar1) & (uVar2 ^ uVar1)) < 0;
    (this->reg).sr.z = (uint)lVar3 == 0;
    (this->reg).sr.n = (bool)((byte)((ulong)lVar3 >> 0x18) >> 7);
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    (*this->_vptr_Moira[0x19])(this,2);
  }
  return;
}

Assistant:

void
Moira::execCmp(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    cmp<S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
}